

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryHeap.hpp
# Opt level: O2

uint __thiscall
Lib::
BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::Demodulation::Rhs>_>
::bubbleDown(BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::Demodulation::Rhs>_>
             *this,uint index)

{
  UnresolvedSplitRecord *pUVar1;
  UnresolvedSplitRecord *pUVar2;
  uint uVar3;
  uint uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  Comparison CVar9;
  ulong uVar10;
  ulong uVar11;
  UnresolvedSplitRecord *pUVar12;
  
  uVar10 = (ulong)index;
  do {
    while( true ) {
      uVar3 = (uint)uVar10;
      uVar4 = uVar3 * 2;
      if (this->_size < uVar4) {
        return uVar3;
      }
      if (uVar4 != this->_size) break;
LAB_002a85cb:
      CVar9 = Indexing::BindingComparator<Inferences::ALASCA::Demodulation::Rhs>::compare
                        (this->_data1 + uVar10,this->_data1 + uVar4);
      if (CVar9 != GREATER) {
        return uVar3;
      }
      pUVar2 = this->_data1;
      pUVar1 = pUVar2 + uVar10;
      uVar3 = pUVar1->var;
      uVar8 = *(undefined4 *)&pUVar1->field_0x4;
      uVar5 = (pUVar1->original)._content;
      pUVar1 = pUVar2 + uVar4;
      uVar7 = *(undefined4 *)&pUVar1->field_0x4;
      uVar6 = (pUVar1->original)._content;
      pUVar12 = pUVar2 + uVar10;
      pUVar12->var = pUVar1->var;
      *(undefined4 *)&pUVar12->field_0x4 = uVar7;
      (pUVar12->original)._content = uVar6;
      pUVar2 = pUVar2 + uVar4;
      pUVar2->var = uVar3;
      *(undefined4 *)&pUVar2->field_0x4 = uVar8;
      (pUVar2->original)._content = uVar5;
      uVar10 = (ulong)uVar4;
    }
    uVar11 = (ulong)(uVar4 | 1);
    CVar9 = Indexing::BindingComparator<Inferences::ALASCA::Demodulation::Rhs>::compare
                      (this->_data1 + uVar10,this->_data1 + uVar11);
    if (CVar9 != GREATER) goto LAB_002a85cb;
    CVar9 = Indexing::BindingComparator<Inferences::ALASCA::Demodulation::Rhs>::compare
                      (this->_data1 + uVar11,this->_data1 + uVar4);
    pUVar1 = this->_data1;
    pUVar12 = pUVar1 + uVar10;
    if (CVar9 == GREATER) {
      uVar3 = pUVar12->var;
      uVar8 = *(undefined4 *)&pUVar12->field_0x4;
      uVar5 = (pUVar12->original)._content;
      pUVar2 = pUVar1 + uVar4;
      uVar7 = *(undefined4 *)&pUVar2->field_0x4;
      uVar6 = (pUVar2->original)._content;
      pUVar12->var = pUVar2->var;
      *(undefined4 *)&pUVar12->field_0x4 = uVar7;
      (pUVar12->original)._content = uVar6;
      pUVar1 = pUVar1 + uVar4;
      pUVar1->var = uVar3;
      *(undefined4 *)&pUVar1->field_0x4 = uVar8;
      (pUVar1->original)._content = uVar5;
      uVar10 = (ulong)uVar4;
    }
    else {
      uVar3 = pUVar12->var;
      uVar8 = *(undefined4 *)&pUVar12->field_0x4;
      uVar5 = (pUVar12->original)._content;
      pUVar2 = pUVar1 + uVar11;
      uVar7 = *(undefined4 *)&pUVar2->field_0x4;
      uVar6 = (pUVar2->original)._content;
      pUVar12->var = pUVar2->var;
      *(undefined4 *)&pUVar12->field_0x4 = uVar7;
      (pUVar12->original)._content = uVar6;
      pUVar1 = pUVar1 + uVar11;
      pUVar1->var = uVar3;
      *(undefined4 *)&pUVar1->field_0x4 = uVar8;
      (pUVar1->original)._content = uVar5;
      uVar10 = uVar11;
    }
  } while( true );
}

Assistant:

unsigned bubbleDown(unsigned index)
  {
    ASS(index>0 && index<=_size);
    unsigned nextIndex=index<<1;
    while(nextIndex<=_size) {
      if(nextIndex!=_size && Comparator::compare(_data1[index], _data1[nextIndex|1])==GREATER) {
	if(Comparator::compare(_data1[nextIndex|1], _data1[nextIndex])==GREATER) {
	  std::swap(_data1[index], _data1[nextIndex]);
	} else {
	  std::swap(_data1[index], _data1[nextIndex|1]);
	  nextIndex|=1;
	}
      } else if(Comparator::compare(_data1[index], _data1[nextIndex])==GREATER) {
	std::swap(_data1[index], _data1[nextIndex]);
      } else {
	return index;
      }
      index=nextIndex;
      nextIndex=index<<1;
    }
    return index;
  }